

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O0

void Gia_ManPrintFanio(Gia_Man_t *pGia,int nNodes)

{
  int iVar1;
  abctime aVar2;
  Cof_Man_t *p_00;
  int *piVar3;
  abctime aVar4;
  abctime clk;
  Cof_Man_t *p;
  int nNodes_local;
  Gia_Man_t *pGia_local;
  
  aVar2 = Abc_Clock();
  p_00 = Cof_ManCreateLogicSimple(pGia);
  iVar1 = Gia_ManLevelNum(pGia);
  p_00->nLevels = iVar1 + 1;
  piVar3 = (int *)calloc((long)p_00->nLevels,4);
  p_00->pLevels = piVar3;
  Cof_ManPrintFanio(p_00);
  if (0 < nNodes) {
    Cof_ManResetTravId(p_00);
    Gia_ManHashStart(pGia);
    Cof_ManPrintHighFanout(p_00,nNodes);
    Gia_ManHashStop(pGia);
    Abc_Print(1,"%s =","Memory for logic network");
    Abc_Print(1,"%10.3f MB  ",((double)(p_00->nObjData << 2) * 1.0) / 1048576.0);
    Abc_Print(1,"%s =","Time");
    aVar4 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar4 - aVar2) * 1.0) / 1000000.0);
  }
  Cof_ManStop(p_00);
  return;
}

Assistant:

void Gia_ManPrintFanio( Gia_Man_t * pGia, int nNodes )
{
    Cof_Man_t * p;
    abctime clk = Abc_Clock();
    p = Cof_ManCreateLogicSimple( pGia );
    p->nLevels = 1 + Gia_ManLevelNum( pGia );
    p->pLevels = ABC_CALLOC( int, p->nLevels );
    Cof_ManPrintFanio( p );

    if ( nNodes > 0 )
    {
    Cof_ManResetTravId( p );
    Gia_ManHashStart( pGia );
    Cof_ManPrintHighFanout( p, nNodes );
    Gia_ManHashStop( pGia );
ABC_PRMn( "Memory for logic network", 4*p->nObjData );
ABC_PRT( "Time", Abc_Clock() - clk );
    }

    Cof_ManStop( p );
}